

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientUtils.cpp
# Opt level: O1

bool ClientUtils::IsValidMulticastIP(string *i_MulticastIPAddress)

{
  int iVar1;
  char *__cp;
  _func_int ***ppp_Var2;
  execution_context eVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  service *psVar7;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Alloc_hider _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint uVar11;
  error_code Error;
  io_service Service;
  resolver Resolver;
  query Query;
  undefined8 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  io_context local_118;
  string local_108;
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_e8;
  basic_resolver_query<boost::asio::ip::tcp> local_a0;
  
  boost::asio::io_context::io_context(&local_118);
  boost::system::error_code::error_code((error_code *)&local_128);
  __cp = (i_MulticastIPAddress->_M_dataplus)._M_p;
  piVar6 = __errno_location();
  *piVar6 = 0;
  iVar5 = inet_pton(2,__cp,&local_a0);
  iVar1 = *piVar6;
  if (boost::system::system_category()::system_category_instance == '\0') {
    IsValidMulticastIP();
  }
  bVar4 = (bool)(**(code **)(boost::system::system_category()::system_category_instance + 0x30))
                          (&boost::system::system_category()::system_category_instance,iVar1);
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT17(local_e8.service_._2_1_,
                          CONCAT25(local_e8.service_._0_2_,CONCAT14(bVar4,iVar1)));
  p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                &boost::system::system_category()::system_category_instance;
  if (iVar5 < 1 && bVar4 == false) {
    boost::system::error_code::operator=((error_code *)&local_128,invalid_argument);
  }
  uVar11 = 0;
  if (0 < iVar5) {
    uVar11 = local_a0.hints_.ai_flags;
  }
  if (local_128._4_1_ == true) {
    boost::asio::detail::
    io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::io_object_impl<boost::asio::io_context>(&local_e8,&local_118,(type *)0x0);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
              (&local_a0,i_MulticastIPAddress,&local_108,address_configured);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    boost::asio::detail::resolver_service<boost::asio::ip::tcp>::resolve
              ((results_type *)&local_108,
               (resolver_service<boost::asio::ip::tcp> *)
               CONCAT53(local_e8.service_._3_5_,
                        CONCAT12(local_e8.service_._2_1_,local_e8.service_._0_2_)),
               &local_e8.implementation_,&local_a0,(error_code *)&local_128);
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
    if (local_128._4_1_ == false) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        uVar8 = local_108.field_2._M_allocated_capacity;
        _Var10._M_p = local_108._M_dataplus._M_p;
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
        do {
          boost::system::error_code::error_code((error_code *)&local_108);
          local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p;
          p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
          p_Var9 = this;
          if (*(short *)(*(size_type *)_Var10._M_p + uVar8 * 0x60) == 2) {
            uVar11 = *(uint *)(*(size_type *)_Var10._M_p + 4 + uVar8 * 0x60);
            break;
          }
          uVar8 = uVar8 + 1;
          if (uVar8 == ((long)(*(size_type *)((long)_Var10._M_p + 8) - *(size_type *)_Var10._M_p) >>
                       5) * -0x5555555555555555) {
            _Var10._M_p = (pointer)0x0;
            uVar8 = 0;
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              _Var10._M_p = (pointer)0x0;
              uVar8 = 0;
              p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
          }
          this = p_Var9;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var10._M_p !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
      }
    }
    else {
      uVar11 = 0;
    }
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.service_name_._M_dataplus._M_p != &local_a0.service_name_.field_2) {
      operator_delete(local_a0.service_name_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.host_name_._M_dataplus._M_p != &local_a0.host_name_.field_2) {
      operator_delete(local_a0.host_name_._M_dataplus._M_p);
    }
    boost::asio::detail::
    io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl(&local_e8);
  }
  for (psVar7 = (local_118.super_execution_context.service_registry_)->first_service_;
      eVar3.service_registry_ = local_118.super_execution_context.service_registry_,
      psVar7 != (service *)0x0; psVar7 = psVar7->next_) {
    (*psVar7->_vptr_service[2])(psVar7);
  }
  psVar7 = (local_118.super_execution_context.service_registry_)->first_service_;
  while (psVar7 != (service *)0x0) {
    ppp_Var2 = &psVar7->_vptr_service;
    psVar7 = psVar7->next_;
    (*(*ppp_Var2)[1])();
    (eVar3.service_registry_)->first_service_ = psVar7;
  }
  if (local_118.super_execution_context.service_registry_ != (service_registry *)0x0) {
    pthread_mutex_destroy
              ((pthread_mutex_t *)&(local_118.super_execution_context.service_registry_)->mutex_);
    operator_delete(local_118.super_execution_context.service_registry_);
  }
  return uVar11 == 0xffffffff || (uVar11 & 0xf0) == 0xe0;
}

Assistant:

bool IsValidMulticastIP( const std::string & i_MulticastIPAddress )
  {
    boost::asio::io_service Service;
    boost::system::error_code Error;
    boost::asio::ip::address_v4 Address = boost::asio::ip::address_v4::from_string( i_MulticastIPAddress, Error );
    if( Error )
    {
      boost::asio::ip::tcp::resolver Resolver( Service );
      boost::asio::ip::tcp::resolver::query Query( i_MulticastIPAddress, "" );
      
      boost::asio::ip::tcp::resolver::iterator It = Resolver.resolve( Query, Error );
      boost::asio::ip::tcp::resolver::iterator End;
      
      if( ! Error )
      {
        for( ; It != End; ++It )
        {
          Error = boost::system::error_code();
          boost::asio::ip::tcp::endpoint EndPoint( *It );

          // Currently we only handle IPv4
          if( EndPoint.address().is_v4() )
          {
            Address = EndPoint.address().to_v4();
            break;
          }
        }
      }
      else
      {
        Address = boost::asio::ip::address_v4();
      }
    }

    return( Address.is_multicast() || ( Address.to_ulong() == 0xFFFFFFFF ) );
  }